

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

ostream * google::operator<<(ostream *os,PRIVATE_Counter *param_2)

{
  int iVar1;
  LogStream *pLVar2;
  ostream *poVar3;
  ostream *in_RDI;
  bool bVar4;
  LogStream *log;
  char *in_stack_ffffffffffffff78;
  LogMessageFatal *in_stack_ffffffffffffff80;
  LogStream *local_58;
  LogMessage local_30;
  LogMessageVoidify local_19;
  LogStream *local_18;
  ostream *local_8;
  
  local_8 = in_RDI;
  if (in_RDI == (ostream *)0x0) {
    local_58 = (LogStream *)0x0;
  }
  else {
    local_58 = (LogStream *)
               __dynamic_cast(in_RDI,&std::ostream::typeinfo,&LogMessage::LogStream::typeinfo,0);
  }
  local_18 = local_58;
  bVar4 = false;
  if (local_58 != (LogStream *)0x0) {
    pLVar2 = LogMessage::LogStream::self(local_58);
    bVar4 = local_58 == pLVar2;
  }
  if (bVar4) {
    poVar3 = local_8;
    iVar1 = LogMessage::LogStream::ctr(local_18);
    std::ostream::operator<<(poVar3,iVar1);
    return local_8;
  }
  LogMessageVoidify::LogMessageVoidify(&local_19);
  LogMessageFatal::LogMessageFatal(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,0);
  poVar3 = LogMessage::stream(&local_30);
  poVar3 = std::operator<<(poVar3,"Check failed: log && log == log->self() ");
  poVar3 = std::operator<<(poVar3,"You must not use COUNTER with non-glog ostream");
  LogMessageVoidify::operator&(&local_19,poVar3);
  LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LAB_0013586d);
}

Assistant:

ostream& operator<<(ostream &os, const PRIVATE_Counter&) {
#ifdef DISABLE_RTTI
  LogMessage::LogStream *log = static_cast<LogMessage::LogStream*>(&os);
#else
  LogMessage::LogStream *log = dynamic_cast<LogMessage::LogStream*>(&os);
#endif
  CHECK(log && log == log->self())
      << "You must not use COUNTER with non-glog ostream";
  os << log->ctr();
  return os;
}